

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  value_type vVar9;
  value_type vVar10;
  AssertionResult gtest_ar__12;
  int i_1;
  int i;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  TypeParam ht3;
  Alloc<int,_unsigned_long,_18446744073709551615UL> alloc;
  hasher hasher;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined4 in_stack_fffffffffffff7f8;
  int in_stack_fffffffffffff7fc;
  value_type in_stack_fffffffffffff800;
  key_equal *in_stack_fffffffffffff808;
  undefined7 in_stack_fffffffffffff810;
  undefined1 in_stack_fffffffffffff817;
  size_type in_stack_fffffffffffff818;
  int iVar11;
  undefined6 in_stack_fffffffffffff820;
  undefined1 in_stack_fffffffffffff826;
  undefined1 in_stack_fffffffffffff827;
  undefined8 in_stack_fffffffffffff828;
  Type TVar12;
  undefined4 in_stack_fffffffffffff830;
  undefined4 uVar13;
  undefined1 in_stack_fffffffffffff834;
  undefined1 in_stack_fffffffffffff835;
  undefined1 in_stack_fffffffffffff836;
  undefined1 in_stack_fffffffffffff837;
  char *expected_predicate_value;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *this_00;
  char *in_stack_fffffffffffff870;
  AssertionResult *in_stack_fffffffffffff878;
  AssertHelper *in_stack_fffffffffffff880;
  AssertionResult local_758 [6];
  value_type local_6ec;
  int local_6e4;
  value_type *in_stack_fffffffffffff938;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff940;
  int local_67c;
  string local_678 [55];
  undefined1 local_641;
  AssertionResult local_640 [6];
  value_type local_5d8;
  string local_5d0 [55];
  byte local_599;
  AssertionResult local_598;
  string local_588 [55];
  undefined1 local_551;
  AssertionResult local_550 [6];
  value_type local_4e8;
  string local_4e0 [55];
  byte local_4a9;
  AssertionResult local_4a8;
  string local_498 [55];
  undefined1 local_461;
  AssertionResult local_460 [10];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_3b8 [2];
  string local_398 [55];
  undefined1 local_361;
  AssertionResult local_360;
  string local_350 [55];
  byte local_319;
  AssertionResult local_318;
  string local_308 [55];
  undefined1 local_2d1;
  AssertionResult local_2d0;
  key_type local_2bc;
  string local_2b8 [55];
  byte local_281;
  AssertionResult local_280;
  string local_270 [55];
  undefined1 local_239;
  AssertionResult local_238;
  string local_228 [55];
  byte local_1f1;
  AssertionResult local_1f0;
  string local_1e0 [55];
  undefined1 local_1a9;
  AssertionResult local_1a8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_198 [13];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_c8;
  char local_b8 [184];
  
  TVar12 = (Type)((ulong)in_stack_fffffffffffff828 >> 0x20);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc);
  expected_predicate_value = local_b8;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc);
  this_00 = &local_c8;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(this_00,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT17(in_stack_fffffffffffff827,
                         CONCAT16(in_stack_fffffffffffff826,in_stack_fffffffffffff820)),
             in_stack_fffffffffffff818,
             (hasher *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
             in_stack_fffffffffffff808,(allocator_type *)in_stack_fffffffffffff800);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_c8);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_198,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT17(in_stack_fffffffffffff827,
                         CONCAT16(in_stack_fffffffffffff826,in_stack_fffffffffffff820)),
             in_stack_fffffffffffff818,
             (hasher *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
             in_stack_fffffffffffff808,(allocator_type *)in_stack_fffffffffffff800);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_198);
  local_1a9 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff800,
                           (BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff800,
             (bool *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),(type *)0xedf790)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff837,
                        CONCAT16(in_stack_fffffffffffff836,
                                 CONCAT15(in_stack_fffffffffffff835,
                                          CONCAT14(in_stack_fffffffffffff834,
                                                   in_stack_fffffffffffff830)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870,(char *)this_00,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff837,
                        CONCAT16(in_stack_fffffffffffff836,
                                 CONCAT15(in_stack_fffffffffffff835,
                                          CONCAT14(in_stack_fffffffffffff834,
                                                   in_stack_fffffffffffff830)))),TVar12,
               (char *)CONCAT17(in_stack_fffffffffffff827,
                                CONCAT16(in_stack_fffffffffffff826,in_stack_fffffffffffff820)),
               (int)(in_stack_fffffffffffff818 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff880,(Message *)in_stack_fffffffffffff878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff800);
    std::__cxx11::string::~string(local_1e0);
    testing::Message::~Message((Message *)0xedf8d4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xedf968);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff800,
                       (BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  local_1f1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff800,
             (bool *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),(type *)0xedf9a6)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff837,
                        CONCAT16(in_stack_fffffffffffff836,
                                 CONCAT15(in_stack_fffffffffffff835,
                                          CONCAT14(in_stack_fffffffffffff834,
                                                   in_stack_fffffffffffff830)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870,(char *)this_00,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff837,
                        CONCAT16(in_stack_fffffffffffff836,
                                 CONCAT15(in_stack_fffffffffffff835,
                                          CONCAT14(in_stack_fffffffffffff834,
                                                   in_stack_fffffffffffff830)))),TVar12,
               (char *)CONCAT17(in_stack_fffffffffffff827,
                                CONCAT16(in_stack_fffffffffffff826,in_stack_fffffffffffff820)),
               (int)(in_stack_fffffffffffff818 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff880,(Message *)in_stack_fffffffffffff878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff800);
    std::__cxx11::string::~string(local_228);
    testing::Message::~Message((Message *)0xedfa7b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xedfb0f);
  local_239 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff800,
                           (BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff800,
             (bool *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),(type *)0xedfb50)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff837,
                        CONCAT16(in_stack_fffffffffffff836,
                                 CONCAT15(in_stack_fffffffffffff835,
                                          CONCAT14(in_stack_fffffffffffff834,
                                                   in_stack_fffffffffffff830)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870,(char *)this_00,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff837,
                        CONCAT16(in_stack_fffffffffffff836,
                                 CONCAT15(in_stack_fffffffffffff835,
                                          CONCAT14(in_stack_fffffffffffff834,
                                                   in_stack_fffffffffffff830)))),TVar12,
               (char *)CONCAT17(in_stack_fffffffffffff827,
                                CONCAT16(in_stack_fffffffffffff826,in_stack_fffffffffffff820)),
               (int)(in_stack_fffffffffffff818 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff880,(Message *)in_stack_fffffffffffff878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff800);
    std::__cxx11::string::~string(local_270);
    testing::Message::~Message((Message *)0xedfc25);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xedfcb9);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff800,
                       (BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  local_281 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff800,
             (bool *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),(type *)0xedfcfc)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_280);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff837,
                        CONCAT16(in_stack_fffffffffffff836,
                                 CONCAT15(in_stack_fffffffffffff835,
                                          CONCAT14(in_stack_fffffffffffff834,
                                                   in_stack_fffffffffffff830)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870,(char *)this_00,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff837,
                        CONCAT16(in_stack_fffffffffffff836,
                                 CONCAT15(in_stack_fffffffffffff835,
                                          CONCAT14(in_stack_fffffffffffff834,
                                                   in_stack_fffffffffffff830)))),TVar12,
               (char *)CONCAT17(in_stack_fffffffffffff827,
                                CONCAT16(in_stack_fffffffffffff826,in_stack_fffffffffffff820)),
               (int)(in_stack_fffffffffffff818 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff880,(Message *)in_stack_fffffffffffff878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff800);
    std::__cxx11::string::~string(local_2b8);
    testing::Message::~Message((Message *)0xedfdd1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xedfe68);
  local_2bc = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
                          (int)((ulong)in_stack_fffffffffffff808 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff800,
                    (key_type *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  uVar2 = google::
          BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff800,
                       (BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  local_2d1 = uVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff800,
             (bool *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),(type *)0xedfee0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff836,
                                       CONCAT15(in_stack_fffffffffffff835,
                                                CONCAT14(in_stack_fffffffffffff834,
                                                         in_stack_fffffffffffff830)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870,(char *)this_00,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff836,
                                       CONCAT15(in_stack_fffffffffffff835,
                                                CONCAT14(in_stack_fffffffffffff834,
                                                         in_stack_fffffffffffff830)))),TVar12,
               (char *)CONCAT17(in_stack_fffffffffffff827,
                                CONCAT16(in_stack_fffffffffffff826,in_stack_fffffffffffff820)),
               (int)(in_stack_fffffffffffff818 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff880,(Message *)in_stack_fffffffffffff878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff800);
    std::__cxx11::string::~string(local_308);
    testing::Message::~Message((Message *)0xedffb5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee0049);
  uVar3 = google::
          BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff800,
                       (BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  local_319 = ~uVar3 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff800,
             (bool *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),(type *)0xee008c)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_318);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffff835,
                                                      CONCAT14(in_stack_fffffffffffff834,
                                                               in_stack_fffffffffffff830)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870,(char *)this_00,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffff835,
                                                      CONCAT14(in_stack_fffffffffffff834,
                                                               in_stack_fffffffffffff830)))),TVar12,
               (char *)CONCAT17(in_stack_fffffffffffff827,
                                CONCAT16(in_stack_fffffffffffff826,in_stack_fffffffffffff820)),
               (int)(in_stack_fffffffffffff818 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff880,(Message *)in_stack_fffffffffffff878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff800);
    std::__cxx11::string::~string(local_350);
    testing::Message::~Message((Message *)0xee0161);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee01f5);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::resize((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)in_stack_fffffffffffff800,
           CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  uVar4 = google::
          BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff800,
                       (BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  local_361 = uVar4;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff800,
             (bool *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),(type *)0xee024a)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_360);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffff834,
                                                                     in_stack_fffffffffffff830)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870,(char *)this_00,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffff834,
                                                                     in_stack_fffffffffffff830)))),
               TVar12,(char *)CONCAT17(in_stack_fffffffffffff827,
                                       CONCAT16(in_stack_fffffffffffff826,in_stack_fffffffffffff820)
                                      ),(int)(in_stack_fffffffffffff818 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff880,(Message *)in_stack_fffffffffffff878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff800);
    std::__cxx11::string::~string(local_398);
    testing::Message::~Message((Message *)0xee031f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee03b6);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_3b8,2,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT17(in_stack_fffffffffffff827,
                         CONCAT16(in_stack_fffffffffffff826,in_stack_fffffffffffff820)),
             in_stack_fffffffffffff818,
             (hasher *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
             in_stack_fffffffffffff808,(allocator_type *)in_stack_fffffffffffff800);
  iVar11 = (int)(in_stack_fffffffffffff818 >> 0x20);
  uVar5 = google::
          BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff800,
                       (BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  local_461 = uVar5;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff800,
             (bool *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),(type *)0xee044a)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_460);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,in_stack_fffffffffffff830
                                                                    )))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870,(char *)this_00,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,in_stack_fffffffffffff830
                                                                    )))),TVar12,
               (char *)CONCAT17(in_stack_fffffffffffff827,
                                CONCAT16(in_stack_fffffffffffff826,in_stack_fffffffffffff820)),
               iVar11,(char *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff880,(Message *)in_stack_fffffffffffff878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff800);
    std::__cxx11::string::~string(local_498);
    testing::Message::~Message((Message *)0xee0551);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee05e5);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff800,
                       (BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  uVar13 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff830);
  local_4a9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff800,
             (bool *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),(type *)0xee0628)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4a8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,uVar13)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870,(char *)this_00,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,uVar13)))),TVar12,
               (char *)CONCAT17(in_stack_fffffffffffff827,
                                CONCAT16(in_stack_fffffffffffff826,in_stack_fffffffffffff820)),
               iVar11,(char *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff880,(Message *)in_stack_fffffffffffff878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff800);
    std::__cxx11::string::~string(local_4e0);
    testing::Message::~Message((Message *)0xee06fd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee0794);
  vVar9 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),0);
  local_4e8 = vVar9;
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  uVar6 = google::
          BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff800,
                       (BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  local_551 = uVar6;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff800,
             (bool *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),(type *)0xee0817)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_550);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,uVar13)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870,(char *)this_00,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,uVar13)))),vVar9.second,
               (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffff826,in_stack_fffffffffffff820))
               ,iVar11,(char *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff880,(Message *)in_stack_fffffffffffff878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff800);
    std::__cxx11::string::~string(local_588);
    testing::Message::~Message((Message *)0xee08ec);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee0980);
  uVar7 = google::
          BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff800,
                       (BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  local_599 = ~uVar7 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff800,
             (bool *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),(type *)0xee09c3)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_598);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,uVar13)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870,(char *)this_00,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,uVar13)))),vVar9.second,
               (char *)CONCAT17(uVar6,CONCAT16(uVar7,in_stack_fffffffffffff820)),iVar11,
               (char *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff880,(Message *)in_stack_fffffffffffff878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff800);
    std::__cxx11::string::~string(local_5d0);
    testing::Message::~Message((Message *)0xee0a98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee0b2f);
  vVar10 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),0);
  local_5d8 = vVar10;
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  uVar8 = google::
          BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff800,
                       (BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  local_641 = uVar8;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff800,
             (bool *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),(type *)0xee0bb2)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_640);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,uVar13)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870,(char *)this_00,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,uVar13)))),vVar9.second,
               (char *)CONCAT17(uVar6,CONCAT16(uVar7,in_stack_fffffffffffff820)),vVar10.second,
               (char *)CONCAT17(uVar8,in_stack_fffffffffffff810));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff880,(Message *)in_stack_fffffffffffff878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff800);
    std::__cxx11::string::~string(local_678);
    testing::Message::~Message((Message *)0xee0c87);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee0d1b);
  for (local_67c = 3; local_67c < 0x7d1; local_67c = local_67c + 1) {
    HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),0);
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  }
  local_6e4 = 2000;
  while( true ) {
    TVar12 = vVar9.second;
    iVar11 = vVar10.second;
    if (local_6e4 < 3) break;
    in_stack_fffffffffffff800 =
         HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),0);
    local_6ec = in_stack_fffffffffffff800;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
    local_6e4 = local_6e4 + -1;
  }
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff800,
                       (BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff800,
             (bool *)CONCAT44(CONCAT13(bVar1,(int3)in_stack_fffffffffffff7fc),
                              in_stack_fffffffffffff7f8),(type *)0xee0e4d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_758);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,uVar13)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870,(char *)this_00,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,uVar13)))),TVar12,
               (char *)CONCAT17(uVar6,CONCAT16(uVar7,in_stack_fffffffffffff820)),iVar11,
               (char *)CONCAT17(uVar8,in_stack_fffffffffffff810));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff880,(Message *)in_stack_fffffffffffff878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff800);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff870);
    testing::Message::~Message((Message *)0xee0f07);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee0f95);
  google::
  HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xee0fa2);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_3b8);
  google::
  HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xee0fbc);
  google::
  HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xee0fc9);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}